

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

bool __thiscall Board::solved(Board *this)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  
  cVar2 = '0';
  lVar3 = 0;
  do {
    lVar3 = lVar3 + 3;
    lVar5 = 0;
    do {
      cVar4 = cVar2 + (char)lVar5;
      cVar1 = this->board[0][lVar5];
      if (cVar4 != cVar1) goto LAB_001112ae;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    cVar2 = cVar2 + '\x03';
    this = (Board *)(this->board + 1);
  } while (lVar3 != 9);
LAB_001112ae:
  return cVar4 == cVar1;
}

Assistant:

bool Board::solved() const {
    char cur = '0';

    for (const Board::Row& row : board) {
        for (char tile : row) {
            if (tile != cur++) {
                return false;
            }
        }
    }

    return true;
}